

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool cli::createPath(string *path)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *__path;
  char cVar4;
  undefined1 local_48 [8];
  string part;
  size_type index;
  size_type end;
  string *path_local;
  
  cVar4 = (char)path;
  lVar3 = std::__cxx11::string::find_last_of(cVar4,0x2f);
  part.field_2._8_8_ = std::__cxx11::string::find_first_of(cVar4,0x2f);
  while ((ulong)part.field_2._8_8_ < lVar3 + 1U) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)path);
    bVar1 = isDirectory((string *)local_48);
    if (bVar1) {
LAB_00109ce9:
      bVar1 = false;
    }
    else {
      __path = (char *)std::__cxx11::string::c_str();
      iVar2 = mkdir(__path,0x1ed);
      if (iVar2 == 0) goto LAB_00109ce9;
      path_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_48);
    if (bVar1) goto LAB_00109d29;
    part.field_2._8_8_ = std::__cxx11::string::find_first_of(cVar4,0x2f);
  }
  path_local._7_1_ = 1;
LAB_00109d29:
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool createPath(const std::string &path)
	{
		std::string::size_type end = path.find_last_of('/')+1;
		for (std::string::size_type index = path.find_first_of('/', 0); index < end; index = path.find_first_of('/', index+1))
		{
			std::string part = path.substr(0, index);
			if (!isDirectory(part))
			{
#ifdef _WIN32
				if (CreateDirectoryA(part.c_str(), nullptr) == 0)
					return false;
#else
				if (mkdir(part.c_str(), S_IRWXU | S_IRGRP | S_IXGRP | S_IROTH | S_IXOTH) != 0)
					return false;
#endif
			}
		}

		return true;
	}